

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<short>::test_many<(libdivide::Branching)0>(DivideTest<short> *this,short denom)

{
  ushort uVar1;
  short sVar2;
  short extraout_AX;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  long lVar8;
  divider<short,_(libdivide::Branching)0> the_divider;
  string_class result;
  divider<short,_(libdivide::Branching)0> local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  undefined4 local_38 [4];
  
  if (denom == 0) {
    test_many<(libdivide::Branching)0>();
    sVar2 = extraout_AX;
  }
  else {
    uVar7 = -denom;
    if (0 < denom) {
      uVar7 = denom;
    }
    uVar5 = (ushort)LZCOUNT(uVar7) ^ 0xf;
    if ((uVar7 - 1 & uVar7) == 0) {
      local_4c.div.denom.more = (byte)uVar5 | (byte)((ushort)denom >> 8) & 0x80;
      local_4c.div.denom.magic = 0;
    }
    else {
      uVar3 = (uint)(0x8000 << uVar5) / (uint)uVar7;
      uVar1 = (ushort)uVar3;
      iVar6 = uVar3 * uVar7;
      if (((uint)uVar7 + iVar6 & 0xffff) >> uVar5 == 0) {
        bVar4 = 0xe - (char)LZCOUNT(uVar7);
      }
      else {
        sVar2 = (short)iVar6;
        bVar4 = (byte)uVar5 | 0x40;
        uVar1 = (ushort)(0 < sVar2 || uVar7 <= (ushort)(sVar2 * -2)) + uVar1 * 2;
      }
      local_4c.div.denom.more = bVar4 | 0x80;
      local_4c.div.denom.magic = ~uVar1;
      if (-1 < denom) {
        local_4c.div.denom.more = bVar4;
        local_4c.div.denom.magic = uVar1 + 1;
      }
    }
    sVar2 = libdivide::divider<short,_(libdivide::Branching)0>::recover(&local_4c);
    if (sVar2 == denom) {
      lVar8 = 0;
      do {
        test_one<(libdivide::Branching)0>(this,*(short *)((long)edgeCases + lVar8),denom,&local_4c);
        lVar8 = lVar8 + 2;
      } while (lVar8 != 0xb8);
      test_small_numerators<(libdivide::Branching)0>(this,denom,&local_4c);
      test_pow2_numerators<(libdivide::Branching)0>(this,denom,&local_4c);
      sVar2 = -1;
      do {
        test_one<(libdivide::Branching)0>(this,sVar2,denom,&local_4c);
        sVar2 = sVar2 * 2;
      } while (sVar2 != 0);
      test_random_numerators<(libdivide::Branching)0>(this,denom,&local_4c);
      test_vectordivide_numerators<(libdivide::Branching)0>(this,denom,&local_4c);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to recover divisor for ",0x1e);
  local_48 = local_38;
  local_38[0] = 0x363173;
  local_40 = 3;
  std::operator<<((ostream *)&std::cerr,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,sVar2);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }